

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int fits_clear_Fptr(FITSfile *Fptr,int *status)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(FITSfile **)((long)FptrTable + lVar1) == Fptr) {
      *(undefined8 *)((long)FptrTable + lVar1) = 0;
      break;
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 80000);
  return *status;
}

Assistant:

int fits_clear_Fptr(FITSfile *Fptr,  /* O - FITS file pointer               */ 
           int *status)              /* IO - error status                   */
/*
   clear the Fptr address from the Fptr Table  
*/
{
    int ii;

    FFLOCK;
    for (ii = 0; ii < NMAXFILES; ii++) {
        if (FptrTable[ii] == Fptr) {
            FptrTable[ii] = 0;
            break;
        }
    }
    FFUNLOCK;
    return(*status);
}